

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void arena_stats_merge(tsdn_t *tsdn,arena_t *arena,uint *nthreads,char **dss,ssize_t *dirty_decay_ms
                      ,ssize_t *muzzy_decay_ms,size_t *nactive,size_t *ndirty,size_t *nmuzzy,
                      arena_stats_t *astats,bin_stats_t *bstats,arena_stats_large_t *lstats,
                      arena_stats_extents_t *estats)

{
  arena_stats_u64_t *paVar1;
  uint64_t *puVar2;
  extents_t *extents;
  extents_t *extents_00;
  extents_t *extents_01;
  witness_t **ppwVar3;
  bin_stats_t *pbVar4;
  malloc_mutex_t *mutex;
  long *plVar5;
  uint uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  cache_bin_array_descriptor_t *pcVar10;
  base_t *pbVar11;
  bin_t *pbVar12;
  long lVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  cache_bin_array_descriptor_t *pcVar17;
  uint32_t uVar18;
  atomic_u32_t aVar19;
  int iVar20;
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  size_t sVar24;
  size_t sVar25;
  size_t sVar26;
  long lVar27;
  mutex_prof_data_t *data_4;
  nstime_t *a;
  size_t *psVar28;
  ulong uVar29;
  long lVar30;
  pthread_mutex_t *ppVar31;
  pszind_t pind;
  mutex_prof_data_t *data;
  mutex_prof_data_t *data_3;
  atomic_zu_t *paVar32;
  nstime_t *pnVar33;
  size_t metadata_thp;
  size_t base_resident;
  size_t base_mapped;
  size_t base_allocated;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  arena_basic_stats_merge
            (tsdn,arena,nthreads,dss,dirty_decay_ms,muzzy_decay_ms,nactive,ndirty,nmuzzy);
  base_stats_get(tsdn,arena->base,&local_38,&local_48,&local_40,&local_50);
  (astats->mapped).repr = (astats->mapped).repr + (arena->stats).mapped.repr + local_40;
  extents = &arena->extents_retained;
  sVar21 = extents_npages_get(extents);
  (astats->retained).repr = (astats->retained).repr + sVar21 * 0x1000;
  (astats->extent_avail).repr = (arena->extent_avail_cnt).repr;
  (astats->decay_dirty).npurge.repr =
       (astats->decay_dirty).npurge.repr + (arena->stats).decay_dirty.npurge.repr;
  paVar1 = &(astats->decay_dirty).nmadvise;
  paVar1->repr = paVar1->repr + (arena->stats).decay_dirty.nmadvise.repr;
  paVar1 = &(astats->decay_dirty).purged;
  paVar1->repr = paVar1->repr + (arena->stats).decay_dirty.purged.repr;
  (astats->decay_muzzy).npurge.repr =
       (astats->decay_muzzy).npurge.repr + (arena->stats).decay_muzzy.npurge.repr;
  paVar1 = &(astats->decay_muzzy).nmadvise;
  paVar1->repr = paVar1->repr + (arena->stats).decay_muzzy.nmadvise.repr;
  paVar1 = &(astats->decay_muzzy).purged;
  paVar1->repr = paVar1->repr + (arena->stats).decay_muzzy.purged.repr;
  (astats->base).repr = (astats->base).repr + local_38;
  (astats->internal).repr = (astats->internal).repr + (arena->stats).internal.repr;
  (astats->metadata_thp).repr = (astats->metadata_thp).repr + local_50;
  sVar21 = (arena->nactive).repr;
  extents_00 = &arena->extents_dirty;
  sVar22 = extents_npages_get(extents_00);
  extents_01 = &arena->extents_muzzy;
  sVar23 = extents_npages_get(extents_01);
  (astats->resident).repr = (astats->resident).repr + (sVar23 + sVar22 + sVar21) * 0x1000 + local_48
  ;
  psVar28 = sz_index2size_tab + 0x24;
  lVar27 = 0;
  do {
    uVar7 = (&(arena->stats).lstats[0].nmalloc)[lVar27].repr;
    (&lstats->nmalloc)[lVar27].repr = (&lstats->nmalloc)[lVar27].repr + uVar7;
    (astats->nmalloc_large).repr = (astats->nmalloc_large).repr + uVar7;
    uVar8 = (&(arena->stats).lstats[0].ndalloc)[lVar27].repr;
    (&lstats->ndalloc)[lVar27].repr = (&lstats->ndalloc)[lVar27].repr + uVar8;
    (astats->ndalloc_large).repr = (astats->ndalloc_large).repr + uVar8;
    lVar30 = (&(arena->stats).lstats[0].nrequests)[lVar27].repr + uVar7;
    (&lstats->nrequests)[lVar27].repr = (&lstats->nrequests)[lVar27].repr + lVar30;
    (astats->nrequests_large).repr = (astats->nrequests_large).repr + lVar30;
    (&lstats->nfills)[lVar27].repr = (&lstats->nfills)[lVar27].repr + uVar7;
    (astats->nfills_large).repr = (astats->nfills_large).repr + uVar7;
    uVar9 = (&(arena->stats).lstats[0].nflushes)[lVar27].repr;
    (&lstats->nflushes)[lVar27].repr = (&lstats->nflushes)[lVar27].repr + uVar9;
    (astats->nflushes_large).repr = (astats->nflushes_large).repr + uVar9;
    (&lstats->curlextents)[lVar27] = (&lstats->curlextents)[lVar27] + (uVar7 - uVar8);
    (astats->allocated_large).repr = (astats->allocated_large).repr + (uVar7 - uVar8) * *psVar28;
    lVar27 = lVar27 + 6;
    psVar28 = psVar28 + 1;
  } while (lVar27 != 0x498);
  paVar32 = &estats->retained_bytes;
  lVar27 = 0;
  do {
    pind = (pszind_t)lVar27;
    sVar21 = extents_nextents_get(extents_00,pind);
    sVar22 = extents_nextents_get(extents_01,pind);
    sVar23 = extents_nextents_get(extents,pind);
    sVar24 = extents_nbytes_get(extents_00,pind);
    sVar25 = extents_nbytes_get(extents_01,pind);
    sVar26 = extents_nbytes_get(extents,pind);
    (((arena_stats_extents_t *)(paVar32 + -5))->ndirty).repr = sVar21;
    paVar32[-3].repr = sVar22;
    paVar32[-1].repr = sVar23;
    paVar32[-4].repr = sVar24;
    paVar32[-2].repr = sVar25;
    paVar32->repr = sVar26;
    lVar27 = lVar27 + 1;
    paVar32 = paVar32 + 6;
  } while (lVar27 != 199);
  (astats->tcache_bytes).repr = 0;
  ppVar31 = (pthread_mutex_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x40);
  iVar20 = pthread_mutex_trylock(ppVar31);
  if (iVar20 != 0) {
    malloc_mutex_lock_slow(&arena->tcache_ql_mtx);
    (arena->tcache_ql_mtx).field_0.field_0.locked.repr = true;
  }
  puVar2 = &(arena->tcache_ql_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((arena->tcache_ql_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (arena->tcache_ql_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar3 = &(arena->tcache_ql_mtx).field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  pcVar17 = (arena->cache_bin_array_descriptor_ql).qlh_first;
  while (pcVar17 != (cache_bin_array_descriptor_t *)0x0) {
    psVar28 = sz_index2size_tab;
    lVar27 = 0;
    do {
      (astats->tcache_bytes).repr =
           (astats->tcache_bytes).repr +
           (long)(&pcVar17->bins_small->ncached)[lVar27 * 2] * *psVar28;
      lVar27 = lVar27 + 3;
      psVar28 = psVar28 + 1;
    } while (lVar27 != 0x6c);
    if (0x24 < nhbins) {
      uVar29 = 0x24;
      lVar27 = 0x364;
      do {
        (astats->tcache_bytes).repr =
             (astats->tcache_bytes).repr +
             (long)*(int *)((long)&pcVar17->bins_large->low_water + lVar27) *
             sz_index2size_tab[uVar29];
        uVar29 = uVar29 + 1;
        lVar27 = lVar27 + 0x18;
      } while (uVar29 < nhbins);
    }
    pcVar10 = (pcVar17->link).qre_next;
    pcVar17 = (cache_bin_array_descriptor_t *)0x0;
    if (pcVar10 != (arena->cache_bin_array_descriptor_ql).qlh_first) {
      pcVar17 = pcVar10;
    }
  }
  uVar7 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar8 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.max_wait_time.ns;
  uVar9 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_wait_times;
  uVar14 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_spin_acquired;
  uVar18 = *(uint32_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x20);
  aVar19.repr = *(uint32_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x24);
  uVar15 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_owner_switches;
  uVar16 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[8].prev_owner =
       (arena->tcache_ql_mtx).field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[8].n_lock_ops = uVar16;
  astats->mutex_prof_data[8].max_n_thds = uVar18;
  astats->mutex_prof_data[8].n_waiting_thds = (atomic_u32_t)aVar19.repr;
  astats->mutex_prof_data[8].n_owner_switches = uVar15;
  astats->mutex_prof_data[8].n_wait_times = uVar9;
  astats->mutex_prof_data[8].n_spin_acquired = uVar14;
  astats->mutex_prof_data[8].tot_wait_time.ns = uVar7;
  astats->mutex_prof_data[8].max_wait_time.ns = uVar8;
  astats->mutex_prof_data[8].n_waiting_thds.repr = 0;
  (arena->tcache_ql_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(ppVar31);
  ppVar31 = (pthread_mutex_t *)((long)&(arena->large_mtx).field_0 + 0x40);
  iVar20 = pthread_mutex_trylock(ppVar31);
  if (iVar20 != 0) {
    malloc_mutex_lock_slow(&arena->large_mtx);
    (arena->large_mtx).field_0.field_0.locked.repr = true;
  }
  puVar2 = &(arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((arena->large_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (arena->large_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar3 = &(arena->large_mtx).field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  uVar7 = (arena->large_mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar8 = (arena->large_mtx).field_0.field_0.prof_data.max_wait_time.ns;
  uVar9 = (arena->large_mtx).field_0.field_0.prof_data.n_wait_times;
  uVar14 = (arena->large_mtx).field_0.field_0.prof_data.n_spin_acquired;
  uVar18 = *(uint32_t *)((long)&(arena->large_mtx).field_0 + 0x20);
  aVar19.repr = *(uint32_t *)((long)&(arena->large_mtx).field_0 + 0x24);
  uVar15 = (arena->large_mtx).field_0.field_0.prof_data.n_owner_switches;
  uVar16 = (arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[0].prev_owner = (arena->large_mtx).field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[0].n_lock_ops = uVar16;
  astats->mutex_prof_data[0].max_n_thds = uVar18;
  astats->mutex_prof_data[0].n_waiting_thds = (atomic_u32_t)aVar19.repr;
  astats->mutex_prof_data[0].n_owner_switches = uVar15;
  astats->mutex_prof_data[0].n_wait_times = uVar9;
  astats->mutex_prof_data[0].n_spin_acquired = uVar14;
  astats->mutex_prof_data[0].tot_wait_time.ns = uVar7;
  astats->mutex_prof_data[0].max_wait_time.ns = uVar8;
  astats->mutex_prof_data[0].n_waiting_thds.repr = 0;
  (arena->large_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(ppVar31);
  ppVar31 = (pthread_mutex_t *)((long)&(arena->extent_avail_mtx).field_0 + 0x40);
  iVar20 = pthread_mutex_trylock(ppVar31);
  if (iVar20 != 0) {
    malloc_mutex_lock_slow(&arena->extent_avail_mtx);
    (arena->extent_avail_mtx).field_0.field_0.locked.repr = true;
  }
  puVar2 = &(arena->extent_avail_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((arena->extent_avail_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (arena->extent_avail_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar3 = &(arena->extent_avail_mtx).field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  uVar7 = (arena->extent_avail_mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar8 = (arena->extent_avail_mtx).field_0.field_0.prof_data.max_wait_time.ns;
  uVar9 = (arena->extent_avail_mtx).field_0.field_0.prof_data.n_wait_times;
  uVar14 = (arena->extent_avail_mtx).field_0.field_0.prof_data.n_spin_acquired;
  uVar18 = *(uint32_t *)((long)&(arena->extent_avail_mtx).field_0 + 0x20);
  aVar19.repr = *(uint32_t *)((long)&(arena->extent_avail_mtx).field_0 + 0x24);
  uVar15 = (arena->extent_avail_mtx).field_0.field_0.prof_data.n_owner_switches;
  uVar16 = (arena->extent_avail_mtx).field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[1].prev_owner =
       (arena->extent_avail_mtx).field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[1].n_lock_ops = uVar16;
  astats->mutex_prof_data[1].max_n_thds = uVar18;
  astats->mutex_prof_data[1].n_waiting_thds = (atomic_u32_t)aVar19.repr;
  astats->mutex_prof_data[1].n_owner_switches = uVar15;
  astats->mutex_prof_data[1].n_wait_times = uVar9;
  astats->mutex_prof_data[1].n_spin_acquired = uVar14;
  astats->mutex_prof_data[1].tot_wait_time.ns = uVar7;
  astats->mutex_prof_data[1].max_wait_time.ns = uVar8;
  astats->mutex_prof_data[1].n_waiting_thds.repr = 0;
  (arena->extent_avail_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(ppVar31);
  ppVar31 = (pthread_mutex_t *)((long)&(arena->extents_dirty).mtx.field_0 + 0x40);
  iVar20 = pthread_mutex_trylock(ppVar31);
  if (iVar20 != 0) {
    malloc_mutex_lock_slow(&extents_00->mtx);
    (arena->extents_dirty).mtx.field_0.field_0.locked.repr = true;
  }
  puVar2 = &(arena->extents_dirty).mtx.field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((arena->extents_dirty).mtx.field_0.field_0.prof_data.prev_owner != tsdn) {
    (arena->extents_dirty).mtx.field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar3 = &(arena->extents_dirty).mtx.field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  uVar7 = (extents_00->mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar8 = (arena->extents_dirty).mtx.field_0.field_0.prof_data.max_wait_time.ns;
  uVar9 = (arena->extents_dirty).mtx.field_0.field_0.prof_data.n_wait_times;
  uVar14 = (arena->extents_dirty).mtx.field_0.field_0.prof_data.n_spin_acquired;
  uVar18 = *(uint32_t *)((long)&(arena->extents_dirty).mtx.field_0 + 0x20);
  aVar19.repr = *(uint32_t *)((long)&(arena->extents_dirty).mtx.field_0 + 0x24);
  uVar15 = (arena->extents_dirty).mtx.field_0.field_0.prof_data.n_owner_switches;
  uVar16 = (arena->extents_dirty).mtx.field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[2].prev_owner =
       (arena->extents_dirty).mtx.field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[2].n_lock_ops = uVar16;
  astats->mutex_prof_data[2].max_n_thds = uVar18;
  astats->mutex_prof_data[2].n_waiting_thds = (atomic_u32_t)aVar19.repr;
  astats->mutex_prof_data[2].n_owner_switches = uVar15;
  astats->mutex_prof_data[2].n_wait_times = uVar9;
  astats->mutex_prof_data[2].n_spin_acquired = uVar14;
  astats->mutex_prof_data[2].tot_wait_time.ns = uVar7;
  astats->mutex_prof_data[2].max_wait_time.ns = uVar8;
  astats->mutex_prof_data[2].n_waiting_thds.repr = 0;
  (arena->extents_dirty).mtx.field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(ppVar31);
  ppVar31 = (pthread_mutex_t *)((long)&(arena->extents_muzzy).mtx.field_0 + 0x40);
  iVar20 = pthread_mutex_trylock(ppVar31);
  if (iVar20 != 0) {
    malloc_mutex_lock_slow(&extents_01->mtx);
    (arena->extents_muzzy).mtx.field_0.field_0.locked.repr = true;
  }
  puVar2 = &(arena->extents_muzzy).mtx.field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((arena->extents_muzzy).mtx.field_0.field_0.prof_data.prev_owner != tsdn) {
    (arena->extents_muzzy).mtx.field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar3 = &(arena->extents_muzzy).mtx.field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  uVar7 = (extents_01->mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar8 = (arena->extents_muzzy).mtx.field_0.field_0.prof_data.max_wait_time.ns;
  uVar9 = (arena->extents_muzzy).mtx.field_0.field_0.prof_data.n_wait_times;
  uVar14 = (arena->extents_muzzy).mtx.field_0.field_0.prof_data.n_spin_acquired;
  uVar18 = *(uint32_t *)((long)&(arena->extents_muzzy).mtx.field_0 + 0x20);
  aVar19.repr = *(uint32_t *)((long)&(arena->extents_muzzy).mtx.field_0 + 0x24);
  uVar15 = (arena->extents_muzzy).mtx.field_0.field_0.prof_data.n_owner_switches;
  uVar16 = (arena->extents_muzzy).mtx.field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[3].prev_owner =
       (arena->extents_muzzy).mtx.field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[3].n_lock_ops = uVar16;
  astats->mutex_prof_data[3].max_n_thds = uVar18;
  astats->mutex_prof_data[3].n_waiting_thds = (atomic_u32_t)aVar19.repr;
  astats->mutex_prof_data[3].n_owner_switches = uVar15;
  astats->mutex_prof_data[3].n_wait_times = uVar9;
  astats->mutex_prof_data[3].n_spin_acquired = uVar14;
  astats->mutex_prof_data[3].tot_wait_time.ns = uVar7;
  astats->mutex_prof_data[3].max_wait_time.ns = uVar8;
  astats->mutex_prof_data[3].n_waiting_thds.repr = 0;
  (arena->extents_muzzy).mtx.field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(ppVar31);
  ppVar31 = (pthread_mutex_t *)((long)&(arena->extents_retained).mtx.field_0 + 0x40);
  iVar20 = pthread_mutex_trylock(ppVar31);
  if (iVar20 != 0) {
    malloc_mutex_lock_slow(&extents->mtx);
    (arena->extents_retained).mtx.field_0.field_0.locked.repr = true;
  }
  puVar2 = &(arena->extents_retained).mtx.field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((arena->extents_retained).mtx.field_0.field_0.prof_data.prev_owner != tsdn) {
    (arena->extents_retained).mtx.field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar3 = &(arena->extents_retained).mtx.field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  uVar7 = (extents->mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar8 = (arena->extents_retained).mtx.field_0.field_0.prof_data.max_wait_time.ns;
  uVar9 = (arena->extents_retained).mtx.field_0.field_0.prof_data.n_wait_times;
  uVar14 = (arena->extents_retained).mtx.field_0.field_0.prof_data.n_spin_acquired;
  uVar18 = *(uint32_t *)((long)&(arena->extents_retained).mtx.field_0 + 0x20);
  aVar19.repr = *(uint32_t *)((long)&(arena->extents_retained).mtx.field_0 + 0x24);
  uVar15 = (arena->extents_retained).mtx.field_0.field_0.prof_data.n_owner_switches;
  uVar16 = (arena->extents_retained).mtx.field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[4].prev_owner =
       (arena->extents_retained).mtx.field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[4].n_lock_ops = uVar16;
  astats->mutex_prof_data[4].max_n_thds = uVar18;
  astats->mutex_prof_data[4].n_waiting_thds = (atomic_u32_t)aVar19.repr;
  astats->mutex_prof_data[4].n_owner_switches = uVar15;
  astats->mutex_prof_data[4].n_wait_times = uVar9;
  astats->mutex_prof_data[4].n_spin_acquired = uVar14;
  astats->mutex_prof_data[4].tot_wait_time.ns = uVar7;
  astats->mutex_prof_data[4].max_wait_time.ns = uVar8;
  astats->mutex_prof_data[4].n_waiting_thds.repr = 0;
  (arena->extents_retained).mtx.field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(ppVar31);
  ppVar31 = (pthread_mutex_t *)((long)&(arena->decay_dirty).mtx.field_0 + 0x40);
  iVar20 = pthread_mutex_trylock(ppVar31);
  if (iVar20 != 0) {
    malloc_mutex_lock_slow(&(arena->decay_dirty).mtx);
    (arena->decay_dirty).mtx.field_0.field_0.locked.repr = true;
  }
  puVar2 = &(arena->decay_dirty).mtx.field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((arena->decay_dirty).mtx.field_0.field_0.prof_data.prev_owner != tsdn) {
    (arena->decay_dirty).mtx.field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar3 = &(arena->decay_dirty).mtx.field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  uVar7 = (arena->decay_dirty).mtx.field_0.field_0.prof_data.tot_wait_time.ns;
  uVar8 = (arena->decay_dirty).mtx.field_0.field_0.prof_data.max_wait_time.ns;
  uVar9 = (arena->decay_dirty).mtx.field_0.field_0.prof_data.n_wait_times;
  uVar14 = (arena->decay_dirty).mtx.field_0.field_0.prof_data.n_spin_acquired;
  uVar18 = *(uint32_t *)((long)&(arena->decay_dirty).mtx.field_0 + 0x20);
  aVar19.repr = *(uint32_t *)((long)&(arena->decay_dirty).mtx.field_0 + 0x24);
  uVar15 = (arena->decay_dirty).mtx.field_0.field_0.prof_data.n_owner_switches;
  uVar16 = (arena->decay_dirty).mtx.field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[5].prev_owner =
       (arena->decay_dirty).mtx.field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[5].n_lock_ops = uVar16;
  astats->mutex_prof_data[5].max_n_thds = uVar18;
  astats->mutex_prof_data[5].n_waiting_thds = (atomic_u32_t)aVar19.repr;
  astats->mutex_prof_data[5].n_owner_switches = uVar15;
  astats->mutex_prof_data[5].n_wait_times = uVar9;
  astats->mutex_prof_data[5].n_spin_acquired = uVar14;
  astats->mutex_prof_data[5].tot_wait_time.ns = uVar7;
  astats->mutex_prof_data[5].max_wait_time.ns = uVar8;
  astats->mutex_prof_data[5].n_waiting_thds.repr = 0;
  (arena->decay_dirty).mtx.field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(ppVar31);
  ppVar31 = (pthread_mutex_t *)((long)&(arena->decay_muzzy).mtx.field_0 + 0x40);
  iVar20 = pthread_mutex_trylock(ppVar31);
  if (iVar20 != 0) {
    malloc_mutex_lock_slow(&(arena->decay_muzzy).mtx);
    (arena->decay_muzzy).mtx.field_0.field_0.locked.repr = true;
  }
  puVar2 = &(arena->decay_muzzy).mtx.field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((arena->decay_muzzy).mtx.field_0.field_0.prof_data.prev_owner != tsdn) {
    (arena->decay_muzzy).mtx.field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar3 = &(arena->decay_muzzy).mtx.field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  uVar7 = (arena->decay_muzzy).mtx.field_0.field_0.prof_data.tot_wait_time.ns;
  uVar8 = (arena->decay_muzzy).mtx.field_0.field_0.prof_data.max_wait_time.ns;
  uVar9 = (arena->decay_muzzy).mtx.field_0.field_0.prof_data.n_wait_times;
  uVar14 = (arena->decay_muzzy).mtx.field_0.field_0.prof_data.n_spin_acquired;
  uVar18 = *(uint32_t *)((long)&(arena->decay_muzzy).mtx.field_0 + 0x20);
  aVar19.repr = *(uint32_t *)((long)&(arena->decay_muzzy).mtx.field_0 + 0x24);
  uVar15 = (arena->decay_muzzy).mtx.field_0.field_0.prof_data.n_owner_switches;
  uVar16 = (arena->decay_muzzy).mtx.field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[6].prev_owner =
       (arena->decay_muzzy).mtx.field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[6].n_lock_ops = uVar16;
  astats->mutex_prof_data[6].max_n_thds = uVar18;
  astats->mutex_prof_data[6].n_waiting_thds = (atomic_u32_t)aVar19.repr;
  astats->mutex_prof_data[6].n_owner_switches = uVar15;
  astats->mutex_prof_data[6].n_wait_times = uVar9;
  astats->mutex_prof_data[6].n_spin_acquired = uVar14;
  astats->mutex_prof_data[6].tot_wait_time.ns = uVar7;
  astats->mutex_prof_data[6].max_wait_time.ns = uVar8;
  astats->mutex_prof_data[6].n_waiting_thds.repr = 0;
  (arena->decay_muzzy).mtx.field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(ppVar31);
  pbVar11 = arena->base;
  iVar20 = pthread_mutex_trylock((pthread_mutex_t *)((long)&(pbVar11->mtx).field_0 + 0x40));
  if (iVar20 != 0) {
    malloc_mutex_lock_slow(&pbVar11->mtx);
    (pbVar11->mtx).field_0.field_0.locked.repr = true;
  }
  puVar2 = &(pbVar11->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((pbVar11->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (pbVar11->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar3 = &(pbVar11->mtx).field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  pbVar11 = arena->base;
  uVar7 = (pbVar11->mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar8 = (pbVar11->mtx).field_0.field_0.prof_data.max_wait_time.ns;
  uVar9 = (pbVar11->mtx).field_0.field_0.prof_data.n_wait_times;
  uVar14 = (pbVar11->mtx).field_0.field_0.prof_data.n_spin_acquired;
  uVar18 = *(uint32_t *)((long)&(pbVar11->mtx).field_0 + 0x20);
  aVar19.repr = *(uint32_t *)((long)&(pbVar11->mtx).field_0 + 0x24);
  uVar15 = (pbVar11->mtx).field_0.field_0.prof_data.n_owner_switches;
  uVar16 = (pbVar11->mtx).field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[7].prev_owner = (pbVar11->mtx).field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[7].n_lock_ops = uVar16;
  astats->mutex_prof_data[7].max_n_thds = uVar18;
  astats->mutex_prof_data[7].n_waiting_thds = (atomic_u32_t)aVar19.repr;
  astats->mutex_prof_data[7].n_owner_switches = uVar15;
  astats->mutex_prof_data[7].n_wait_times = uVar9;
  astats->mutex_prof_data[7].n_spin_acquired = uVar14;
  astats->mutex_prof_data[7].tot_wait_time.ns = uVar7;
  astats->mutex_prof_data[7].max_wait_time.ns = uVar8;
  astats->mutex_prof_data[7].n_waiting_thds.repr = 0;
  pbVar11 = arena->base;
  (pbVar11->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar11->mtx).field_0 + 0x40));
  pnVar33 = &astats->uptime;
  nstime_copy(pnVar33,&arena->create_time);
  nstime_update_impl(pnVar33);
  nstime_subtract(pnVar33,&arena->create_time);
  lVar27 = 0;
  do {
    if (bin_infos[lVar27].n_shards != 0) {
      pbVar4 = bstats + lVar27;
      pnVar33 = &bstats[lVar27].mutex_data.max_wait_time;
      lVar30 = 0;
      uVar29 = 0;
      do {
        pbVar12 = arena->bins[lVar27].bin_shards;
        mutex = (malloc_mutex_t *)((long)&(pbVar12->lock).field_0 + lVar30);
        ppVar31 = (pthread_mutex_t *)((long)&(pbVar12->lock).field_0 + lVar30 + 0x40);
        iVar20 = pthread_mutex_trylock(ppVar31);
        if (iVar20 != 0) {
          malloc_mutex_lock_slow(mutex);
          *(undefined1 *)((long)&(pbVar12->lock).field_0 + lVar30 + 0x68) = 1;
        }
        plVar5 = (long *)((long)&(pbVar12->lock).field_0 + lVar30 + 0x38);
        *plVar5 = *plVar5 + 1;
        if (*(tsdn_t **)((long)&(pbVar12->lock).field_0 + lVar30 + 0x30) != tsdn) {
          *(tsdn_t **)((long)&(pbVar12->lock).field_0 + lVar30 + 0x30) = tsdn;
          plVar5 = (long *)((long)&(pbVar12->lock).field_0 + lVar30 + 0x28);
          *plVar5 = *plVar5 + 1;
        }
        nstime_add(&bstats[lVar27].mutex_data.tot_wait_time,(nstime_t *)mutex);
        a = (nstime_t *)((long)&(pbVar12->lock).field_0 + lVar30 + 8);
        iVar20 = nstime_compare(a,pnVar33);
        if (0 < iVar20) {
          nstime_copy(pnVar33,a);
        }
        plVar5 = (long *)((long)&(pbVar12->lock).field_0 + lVar30 + 0x10);
        lVar13 = plVar5[1];
        (pbVar4->mutex_data).n_wait_times = (pbVar4->mutex_data).n_wait_times + *plVar5;
        (pbVar4->mutex_data).n_spin_acquired = (pbVar4->mutex_data).n_spin_acquired + lVar13;
        uVar6 = *(uint *)((long)&(pbVar12->lock).field_0 + lVar30 + 0x20);
        if ((pbVar4->mutex_data).max_n_thds < uVar6) {
          (pbVar4->mutex_data).max_n_thds = uVar6;
        }
        (pbVar4->mutex_data).n_waiting_thds.repr = 0;
        puVar2 = &(pbVar4->mutex_data).n_owner_switches;
        *puVar2 = *puVar2 + *(long *)((long)&(pbVar12->lock).field_0 + lVar30 + 0x28);
        puVar2 = &(pbVar4->mutex_data).n_lock_ops;
        *puVar2 = *puVar2 + *(long *)((long)&(pbVar12->lock).field_0 + lVar30 + 0x38);
        plVar5 = (long *)((long)&(pbVar12->stats).nmalloc + lVar30);
        lVar13 = plVar5[1];
        pbVar4->nmalloc = pbVar4->nmalloc + *plVar5;
        pbVar4->ndalloc = pbVar4->ndalloc + lVar13;
        plVar5 = (long *)((long)&(pbVar12->stats).nrequests + lVar30);
        lVar13 = plVar5[1];
        pbVar4->nrequests = *plVar5 + pbVar4->nrequests;
        pbVar4->curregs = lVar13 + pbVar4->curregs;
        plVar5 = (long *)((long)&(pbVar12->stats).nfills + lVar30);
        lVar13 = plVar5[1];
        pbVar4->nfills = *plVar5 + pbVar4->nfills;
        pbVar4->nflushes = lVar13 + pbVar4->nflushes;
        plVar5 = (long *)((long)&(pbVar12->stats).nslabs + lVar30);
        lVar13 = plVar5[1];
        pbVar4->nslabs = pbVar4->nslabs + *plVar5;
        pbVar4->reslabs = pbVar4->reslabs + lVar13;
        plVar5 = (long *)((long)&(pbVar12->stats).curslabs + lVar30);
        lVar13 = plVar5[1];
        pbVar4->curslabs = pbVar4->curslabs + *plVar5;
        pbVar4->nonfull_slabs = pbVar4->nonfull_slabs + lVar13;
        *(undefined1 *)((long)&(pbVar12->lock).field_0 + lVar30 + 0x68) = 0;
        pthread_mutex_unlock(ppVar31);
        uVar29 = uVar29 + 1;
        lVar30 = lVar30 + 0x118;
      } while (uVar29 < bin_infos[lVar27].n_shards);
    }
    lVar27 = lVar27 + 1;
  } while (lVar27 != 0x24);
  return;
}

Assistant:

void
arena_stats_merge(tsdn_t *tsdn, arena_t *arena, unsigned *nthreads,
    const char **dss, ssize_t *dirty_decay_ms, ssize_t *muzzy_decay_ms,
    size_t *nactive, size_t *ndirty, size_t *nmuzzy, arena_stats_t *astats,
    bin_stats_t *bstats, arena_stats_large_t *lstats,
    arena_stats_extents_t *estats) {
	cassert(config_stats);

	arena_basic_stats_merge(tsdn, arena, nthreads, dss, dirty_decay_ms,
	    muzzy_decay_ms, nactive, ndirty, nmuzzy);

	size_t base_allocated, base_resident, base_mapped, metadata_thp;
	base_stats_get(tsdn, arena->base, &base_allocated, &base_resident,
	    &base_mapped, &metadata_thp);

	arena_stats_lock(tsdn, &arena->stats);

	arena_stats_accum_zu(&astats->mapped, base_mapped
	    + arena_stats_read_zu(tsdn, &arena->stats, &arena->stats.mapped));
	arena_stats_accum_zu(&astats->retained,
	    extents_npages_get(&arena->extents_retained) << LG_PAGE);

	atomic_store_zu(&astats->extent_avail,
	    atomic_load_zu(&arena->extent_avail_cnt, ATOMIC_RELAXED),
	    ATOMIC_RELAXED);

	arena_stats_accum_u64(&astats->decay_dirty.npurge,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_dirty.npurge));
	arena_stats_accum_u64(&astats->decay_dirty.nmadvise,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_dirty.nmadvise));
	arena_stats_accum_u64(&astats->decay_dirty.purged,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_dirty.purged));

	arena_stats_accum_u64(&astats->decay_muzzy.npurge,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_muzzy.npurge));
	arena_stats_accum_u64(&astats->decay_muzzy.nmadvise,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_muzzy.nmadvise));
	arena_stats_accum_u64(&astats->decay_muzzy.purged,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_muzzy.purged));

	arena_stats_accum_zu(&astats->base, base_allocated);
	arena_stats_accum_zu(&astats->internal, arena_internal_get(arena));
	arena_stats_accum_zu(&astats->metadata_thp, metadata_thp);
	arena_stats_accum_zu(&astats->resident, base_resident +
	    (((atomic_load_zu(&arena->nactive, ATOMIC_RELAXED) +
	    extents_npages_get(&arena->extents_dirty) +
	    extents_npages_get(&arena->extents_muzzy)) << LG_PAGE)));

	for (szind_t i = 0; i < SC_NSIZES - SC_NBINS; i++) {
		uint64_t nmalloc = arena_stats_read_u64(tsdn, &arena->stats,
		    &arena->stats.lstats[i].nmalloc);
		arena_stats_accum_u64(&lstats[i].nmalloc, nmalloc);
		arena_stats_accum_u64(&astats->nmalloc_large, nmalloc);

		uint64_t ndalloc = arena_stats_read_u64(tsdn, &arena->stats,
		    &arena->stats.lstats[i].ndalloc);
		arena_stats_accum_u64(&lstats[i].ndalloc, ndalloc);
		arena_stats_accum_u64(&astats->ndalloc_large, ndalloc);

		uint64_t nrequests = arena_stats_read_u64(tsdn, &arena->stats,
		    &arena->stats.lstats[i].nrequests);
		arena_stats_accum_u64(&lstats[i].nrequests,
		    nmalloc + nrequests);
		arena_stats_accum_u64(&astats->nrequests_large,
		    nmalloc + nrequests);

		/* nfill == nmalloc for large currently. */
		arena_stats_accum_u64(&lstats[i].nfills, nmalloc);
		arena_stats_accum_u64(&astats->nfills_large, nmalloc);

		uint64_t nflush = arena_stats_read_u64(tsdn, &arena->stats,
		    &arena->stats.lstats[i].nflushes);
		arena_stats_accum_u64(&lstats[i].nflushes, nflush);
		arena_stats_accum_u64(&astats->nflushes_large, nflush);

		assert(nmalloc >= ndalloc);
		assert(nmalloc - ndalloc <= SIZE_T_MAX);
		size_t curlextents = (size_t)(nmalloc - ndalloc);
		lstats[i].curlextents += curlextents;
		arena_stats_accum_zu(&astats->allocated_large,
		    curlextents * sz_index2size(SC_NBINS + i));
	}

	for (pszind_t i = 0; i < SC_NPSIZES; i++) {
		size_t dirty, muzzy, retained, dirty_bytes, muzzy_bytes,
		    retained_bytes;
		dirty = extents_nextents_get(&arena->extents_dirty, i);
		muzzy = extents_nextents_get(&arena->extents_muzzy, i);
		retained = extents_nextents_get(&arena->extents_retained, i);
		dirty_bytes = extents_nbytes_get(&arena->extents_dirty, i);
		muzzy_bytes = extents_nbytes_get(&arena->extents_muzzy, i);
		retained_bytes =
		    extents_nbytes_get(&arena->extents_retained, i);

		atomic_store_zu(&estats[i].ndirty, dirty, ATOMIC_RELAXED);
		atomic_store_zu(&estats[i].nmuzzy, muzzy, ATOMIC_RELAXED);
		atomic_store_zu(&estats[i].nretained, retained, ATOMIC_RELAXED);
		atomic_store_zu(&estats[i].dirty_bytes, dirty_bytes,
		    ATOMIC_RELAXED);
		atomic_store_zu(&estats[i].muzzy_bytes, muzzy_bytes,
		    ATOMIC_RELAXED);
		atomic_store_zu(&estats[i].retained_bytes, retained_bytes,
		    ATOMIC_RELAXED);
	}

	arena_stats_unlock(tsdn, &arena->stats);

	/* tcache_bytes counts currently cached bytes. */
	atomic_store_zu(&astats->tcache_bytes, 0, ATOMIC_RELAXED);
	malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);
	cache_bin_array_descriptor_t *descriptor;
	ql_foreach(descriptor, &arena->cache_bin_array_descriptor_ql, link) {
		szind_t i = 0;
		for (; i < SC_NBINS; i++) {
			cache_bin_t *tbin = &descriptor->bins_small[i];
			arena_stats_accum_zu(&astats->tcache_bytes,
			    tbin->ncached * sz_index2size(i));
		}
		for (; i < nhbins; i++) {
			cache_bin_t *tbin = &descriptor->bins_large[i];
			arena_stats_accum_zu(&astats->tcache_bytes,
			    tbin->ncached * sz_index2size(i));
		}
	}
	malloc_mutex_prof_read(tsdn,
	    &astats->mutex_prof_data[arena_prof_mutex_tcache_list],
	    &arena->tcache_ql_mtx);
	malloc_mutex_unlock(tsdn, &arena->tcache_ql_mtx);

#define READ_ARENA_MUTEX_PROF_DATA(mtx, ind)				\
    malloc_mutex_lock(tsdn, &arena->mtx);				\
    malloc_mutex_prof_read(tsdn, &astats->mutex_prof_data[ind],		\
        &arena->mtx);							\
    malloc_mutex_unlock(tsdn, &arena->mtx);

	/* Gather per arena mutex profiling data. */
	READ_ARENA_MUTEX_PROF_DATA(large_mtx, arena_prof_mutex_large);
	READ_ARENA_MUTEX_PROF_DATA(extent_avail_mtx,
	    arena_prof_mutex_extent_avail)
	READ_ARENA_MUTEX_PROF_DATA(extents_dirty.mtx,
	    arena_prof_mutex_extents_dirty)
	READ_ARENA_MUTEX_PROF_DATA(extents_muzzy.mtx,
	    arena_prof_mutex_extents_muzzy)
	READ_ARENA_MUTEX_PROF_DATA(extents_retained.mtx,
	    arena_prof_mutex_extents_retained)
	READ_ARENA_MUTEX_PROF_DATA(decay_dirty.mtx,
	    arena_prof_mutex_decay_dirty)
	READ_ARENA_MUTEX_PROF_DATA(decay_muzzy.mtx,
	    arena_prof_mutex_decay_muzzy)
	READ_ARENA_MUTEX_PROF_DATA(base->mtx,
	    arena_prof_mutex_base)
#undef READ_ARENA_MUTEX_PROF_DATA

	nstime_copy(&astats->uptime, &arena->create_time);
	nstime_update(&astats->uptime);
	nstime_subtract(&astats->uptime, &arena->create_time);

	for (szind_t i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			bin_stats_merge(tsdn, &bstats[i],
			    &arena->bins[i].bin_shards[j]);
		}
	}
}